

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

void __thiscall File::output_binary(File *this,ofstream *out)

{
  Type TVar1;
  pointer pCVar2;
  pointer pFVar3;
  int count;
  variant_alternative_t<0UL,_variant<basic_string<char>,_int,_double>_> *pvVar4;
  variant_alternative_t<1UL,_variant<basic_string<char>,_int,_double>_> *pvVar5;
  variant_alternative_t<2UL,_variant<basic_string<char>,_int,_double>_> *pvVar6;
  pointer pCVar7;
  Function *fun;
  pointer pFVar8;
  u2 v_3;
  u2 functions_count;
  u2 constants_count;
  anon_class_8_1_5a786fbc to_binary;
  char bytes [8];
  anon_class_16_2_09cc686c writeNBytes;
  
  writeNBytes.bytes = &bytes;
  writeNBytes.out = out;
  std::ostream::write((char *)out,0x11754d);
  std::ostream::write((char *)out,0x117c8a);
  constants_count =
       (u2)(((long)(this->constants).super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->constants).super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
                  _M_impl.super__Vector_impl_data._M_start) / 0x30);
  output_binary::anon_class_16_2_09cc686c::operator()(&writeNBytes,&constants_count,2);
  pCVar7 = (this->constants).super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl
           .super__Vector_impl_data._M_start;
  pCVar2 = (this->constants).super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl
           .super__Vector_impl_data._M_finish;
  do {
    if (pCVar7 == pCVar2) {
      to_binary.writeNBytes = &writeNBytes;
      output_binary::anon_class_8_1_5a786fbc::operator()(&to_binary,&this->start);
      functions_count =
           (u2)((uint)(*(int *)&(this->functions).
                                super__Vector_base<vm::Function,_std::allocator<vm::Function>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                      *(int *)&(this->functions).
                               super__Vector_base<vm::Function,_std::allocator<vm::Function>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 5);
      output_binary::anon_class_16_2_09cc686c::operator()(&writeNBytes,&functions_count,2);
      pFVar3 = (this->functions).super__Vector_base<vm::Function,_std::allocator<vm::Function>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pFVar8 = (this->functions).
                    super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
                    super__Vector_impl_data._M_start; pFVar8 != pFVar3; pFVar8 = pFVar8 + 1) {
        v_3 = pFVar8->nameIndex;
        output_binary::anon_class_16_2_09cc686c::operator()(&writeNBytes,&v_3,2);
        v_3 = pFVar8->paramSize;
        output_binary::anon_class_16_2_09cc686c::operator()(&writeNBytes,&v_3,2);
        v_3 = pFVar8->level;
        output_binary::anon_class_16_2_09cc686c::operator()(&writeNBytes,&v_3,2);
        output_binary::anon_class_8_1_5a786fbc::operator()(&to_binary,&pFVar8->instructions);
      }
      return;
    }
    TVar1 = pCVar7->type;
    if (TVar1 == DOUBLE) {
      std::ostream::write((char *)out,0x117554);
      pvVar6 = std::get<2ul,std::__cxx11::string,int,double>(&pCVar7->value);
      to_binary.writeNBytes = (anon_class_16_2_09cc686c *)*pvVar6;
      count = 8;
LAB_0010f0b8:
      output_binary::anon_class_16_2_09cc686c::operator()(&writeNBytes,&to_binary,count);
    }
    else {
      if (TVar1 == INT) {
        std::ostream::write((char *)out,0x117552);
        pvVar5 = std::get<1ul,std::__cxx11::string,int,double>(&pCVar7->value);
        to_binary.writeNBytes._0_4_ = *pvVar5;
        count = 4;
        goto LAB_0010f0b8;
      }
      if (TVar1 != STRING) {
        __assert_fail("(\"unexpected error\", false)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/BUAA-SE-Compiling[P]c0-vm-cpp/src/file.cpp"
                      ,0x65,"void File::output_binary(std::ofstream &)");
      }
      std::ostream::write((char *)out,0x117c8f);
      pvVar4 = std::get<0ul,std::__cxx11::string,int,double>(&pCVar7->value);
      std::__cxx11::string::string((string *)&to_binary,(string *)pvVar4);
      output_binary::anon_class_16_2_09cc686c::operator()(&writeNBytes,&functions_count,2);
      std::ostream::write((char *)out,(long)to_binary.writeNBytes);
      std::__cxx11::string::~string((string *)&to_binary);
    }
    pCVar7 = pCVar7 + 1;
  } while( true );
}

Assistant:

void File::output_binary(std::ofstream& out) {

    char bytes[8];
    const auto writeNBytes = [&](void* addr, int count) {
        assert(0 < count && count <= 8);
        char* p = reinterpret_cast<char*>(addr) + (count-1);
        for (int i = 0; i < count; ++i) {
            bytes[i] = *p--;
        }
        out.write(bytes, count);
    };

    // magic
    out.write("\x43\x30\x3A\x29", 4);
    // version
    out.write("\x00\x00\x00\x01", 4);
    // constants_count
    vm::u2 constants_count = constants.size();
    writeNBytes(&constants_count, sizeof constants_count);
    // constants
    for (auto& constant : constants) {
        switch (constant.type)
        {
        case vm::Constant::Type::STRING: {
            out.write("\x00", 1);
            std::string v = std::get<vm::str_t>(constant.value);
            vm::u2 len = v.length();
            writeNBytes(&len, sizeof len);
            out.write(v.c_str(), len);
        } break;
        case vm::Constant::Type::INT: {
            out.write("\x01", 1);
            vm::int_t v = std::get<vm::int_t>(constant.value);
            writeNBytes(&v, sizeof v);
        } break;
        case vm::Constant::Type::DOUBLE: {
            out.write("\x02", 1);
            vm::double_t v = std::get<vm::double_t>(constant.value);
            writeNBytes(&v, sizeof v);
        } break;
        default: assert(("unexpected error", false)); break;
        }
    }

    auto to_binary = [&](const std::vector<vm::Instruction>& v) {
        vm::u2 instructions_count = v.size();
        writeNBytes(&instructions_count, sizeof instructions_count);
        for (auto& ins : v) {
            vm::u1 op = static_cast<vm::u1>(ins.op); 
            writeNBytes(&op, sizeof op);
            if (auto it = vm::paramSizeOfOpCode.find(ins.op); it != vm::paramSizeOfOpCode.end()) {
                auto paramSizes = it->second;
                switch (paramSizes[0]) {
                #define CASE(n) case n: { vm::u##n x = ins.x; writeNBytes(&x, n); }
                CASE(1); break; 
                CASE(2); break;
                CASE(4); break;
                #undef CASE
                default: assert(("unexpected error", false));
                }
                if (paramSizes.size() == 2) {
                    switch (paramSizes[1]) {
                    #define CASE(n) case n: { vm::u##n y = ins.y; writeNBytes(&y, n); }
                    CASE(1); break; 
                    CASE(2); break;
                    CASE(4); break;
                    #undef CASE
                    default: assert(("unexpected error", false));
                    }
                }
            }
        }
    };

    // start
    to_binary(start);
    // functions_count
    vm::u2 functions_count = functions.size();
    writeNBytes(&functions_count, sizeof functions_count);
    // functions
    for (auto& fun : functions) {
        vm::u2 v;
        v = fun.nameIndex; writeNBytes(&v, sizeof v);
        v = fun.paramSize; writeNBytes(&v, sizeof v);
        v = fun.level;     writeNBytes(&v, sizeof v);
        to_binary(fun.instructions);
    }
}